

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O0

void __thiscall
CTestGen9Resource_Test1DTileYsResourceMips_Test::TestBody
          (CTestGen9Resource_Test1DTileYsResourceMips_Test *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  int local_388;
  AssertHelper local_368;
  Message local_360;
  uint local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_8;
  Message local_338;
  uint local_32c;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_7;
  Message local_310;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_6;
  Message local_2f0;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_5;
  GMM_REQ_OFFSET_INFO OffsetInfo_1;
  int slot;
  Message local_268;
  uint local_25c;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_4;
  uint32_t MipTailOffsets [15];
  AssertHelper local_200;
  Message local_1f8;
  uint local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_3;
  Message local_1d0;
  uint local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_2;
  Message local_1a8;
  uint local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  Message local_180 [3];
  undefined1 local_168 [8];
  AssertionResult gtest_ar;
  GMM_REQ_OFFSET_INFO OffsetInfo;
  int mip;
  uint32_t StartOfMip;
  uint32_t AlignedSize;
  uint32_t PitchInBytes;
  int mip_1;
  uint32_t AlignedWidth;
  uint32_t MipTailStart;
  uint32_t MaxMip;
  GMM_RESOURCE_INFO *ResourceInfo;
  TEST_BPP bpp;
  uint32_t i;
  GMM_RESCREATE_PARAMS gmmParams;
  uint32_t Mts [5];
  uint32_t TileSize [5];
  CTestGen9Resource_Test1DTileYsResourceMips_Test *this_local;
  
  TileSize[0] = 0x4000;
  TileSize[1] = 0x2000;
  TileSize[2] = 0x1000;
  gmmParams.MultiTileArch._0_1_ = 0;
  gmmParams.MultiTileArch.GpuVaMappingSet = 0x80;
  gmmParams.MultiTileArch.LocalMemEligibilitySet = '\0';
  gmmParams.MultiTileArch.LocalMemPreferredSet = '\0';
  gmmParams.MultiTileArch.Reserved = 0x4000;
  unique0x10001370 = this;
  memset(&bpp,0,0x80);
  bpp = TEST_BPP_16;
  gmmParams.ExistingSysMemSize._4_1_ = 1;
  gmmParams.Flags.Gpu =
       (anon_struct_8_45_9b07292e_for_Gpu)
       ((ulong)gmmParams.Flags.Gpu & 0xffffffbfffffffff | 0x4000000000);
  gmmParams._0_8_ = gmmParams._0_8_ & 0xfffffffbffffffff | 0x400000000;
  gmmParams.BaseHeight = 5;
  ResourceInfo._4_4_ = TEST_BPP_8;
  do {
    if (TEST_BPP_128 < ResourceInfo._4_4_) {
      return;
    }
    ResourceInfo._0_4_ = ResourceInfo._4_4_;
    i = CTestResource::SetResourceFormat((CTestResource *)this,ResourceInfo._4_4_);
    gmmParams.CpTag = 0x4000;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 1;
    _MipTailStart =
         (GMM_RESOURCE_INFO *)
         (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                   (CommonULT::pGmmULTClientContext,&bpp);
    mip_1 = gmmParams.BaseHeight;
    for (AlignedWidth = 0; AlignedWidth <= gmmParams.BaseHeight; AlignedWidth = AlignedWidth + 1) {
      if ((ulong)gmmParams._40_8_ >> ((byte)AlignedWidth & 0x3f) <=
          (ulong)Mts[(ulong)ResourceInfo._4_4_ - 2]) {
        mip_1 = AlignedWidth;
        break;
      }
    }
    PitchInBytes = 0;
    for (AlignedSize = 0; AlignedSize <= AlignedWidth; AlignedSize = AlignedSize + 1) {
      PitchInBytes = PitchInBytes +
                     (((int)((ulong)gmmParams._40_8_ >> ((byte)AlignedSize & 0x3f)) +
                      (TileSize[(ulong)ResourceInfo._4_4_ - 2] - 1)) -
                     ((int)((ulong)gmmParams._40_8_ >> ((byte)AlignedSize & 0x3f)) +
                      (TileSize[(ulong)ResourceInfo._4_4_ - 2] - 1) &
                     TileSize[(ulong)ResourceInfo._4_4_ - 2] - 1));
    }
    uVar4 = CTestResource::GetBppValue((CTestResource *)this,(TEST_BPP)ResourceInfo);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,_MipTailStart,TileSize[(ulong)ResourceInfo._4_4_ - 2]);
    CTestResource::VerifyResourceVAlign<false>((CTestResource *)this,_MipTailStart,0);
    CTestResource::VerifyResourcePitch<false>((CTestResource *)this,_MipTailStart,0);
    CTestResource::VerifyResourcePitchInTiles<false>((CTestResource *)this,_MipTailStart,0);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this,_MipTailStart,
               (ulong)((PitchInBytes * uVar4 + 0xfff) - (PitchInBytes * uVar4 + 0xfff & 0xfff)));
    CTestResource::VerifyResourceQPitch<false>((CTestResource *)this,_MipTailStart,0);
    OffsetInfo.StdLayout.TileDepthPitch._4_4_ = 0;
    for (OffsetInfo.StdLayout.TileDepthPitch._0_4_ = 0;
        (uint)OffsetInfo.StdLayout.TileDepthPitch < AlignedWidth;
        OffsetInfo.StdLayout.TileDepthPitch._0_4_ = (uint)OffsetInfo.StdLayout.TileDepthPitch + 1) {
      memset(&gtest_ar.message_,0,0x60);
      gtest_ar.message_.ptr_._0_4_ = (uint)gtest_ar.message_.ptr_ & 0xfffffffe | 1;
      OffsetInfo._0_4_ = (uint)OffsetInfo.StdLayout.TileDepthPitch;
      (**(code **)(*(long *)_MipTailStart + 0x68))(_MipTailStart,&gtest_ar.message_);
      if ((uint)OffsetInfo.StdLayout.TileDepthPitch == 0) {
        local_388 = 0;
      }
      else {
        uVar6 = (ulong)gmmParams._40_8_ >>
                ((char)(uint)OffsetInfo.StdLayout.TileDepthPitch - 1U & 0x3f);
        uVar4 = TileSize[(ulong)ResourceInfo._4_4_ - 2];
        uVar8 = (ulong)gmmParams._40_8_ >>
                ((char)(uint)OffsetInfo.StdLayout.TileDepthPitch - 1U & 0x3f);
        uVar1 = TileSize[(ulong)ResourceInfo._4_4_ - 2];
        uVar2 = TileSize[(ulong)ResourceInfo._4_4_ - 2];
        uVar5 = CTestResource::GetBppValue((CTestResource *)this,(TEST_BPP)ResourceInfo);
        local_388 = (((int)uVar6 + (uVar4 - 1)) - ((int)uVar8 + (uVar1 - 1) & uVar2 - 1)) * uVar5;
      }
      OffsetInfo.StdLayout.TileDepthPitch._4_4_ =
           OffsetInfo.StdLayout.TileDepthPitch._4_4_ + local_388;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_168,"StartOfMip","OffsetInfo.Render.Offset64",
                 (uint *)((long)&OffsetInfo.StdLayout.TileDepthPitch + 4),
                 (unsigned_long *)&OffsetInfo.Lock.Pitch);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
      if (!bVar3) {
        testing::Message::Message(local_180);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x199,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_180);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(local_180);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
      local_19c = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_198,"0",(int *)"OffsetInfo.Render.XOffset",&local_19c,
                 &OffsetInfo.Render);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
      if (!bVar3) {
        testing::Message::Message(&local_1a8);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x19a,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_1a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
      local_1c4 = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_1c0,"0",(int *)"OffsetInfo.Render.YOffset",&local_1c4,
                 (type *)((long)&OffsetInfo.Render.field_0 + 4));
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
      if (!bVar3) {
        testing::Message::Message(&local_1d0);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x19b,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_1d0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
      local_1ec = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_1e8,"0",(int *)"OffsetInfo.Render.ZOffset",&local_1ec,
                 &OffsetInfo.Render.XOffset);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
      if (!bVar3) {
        testing::Message::Message(&local_1f8);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_200,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x19c,pcVar7);
        testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
        testing::internal::AssertHelper::~AssertHelper(&local_200);
        testing::Message::~Message(&local_1f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
    }
    gtest_ar_4.message_.ptr_._0_4_ = 0x8000;
    gtest_ar_4.message_.ptr_._4_4_ = 0x4000;
    local_25c = (**(code **)(*(long *)_MipTailStart + 0x90))();
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_258,"MipTailStart",
               "ResourceInfo->GetPackedMipTailStartLod()",(uint *)&mip_1,&local_25c);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar3) {
      testing::Message::Message(&local_268);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x1a1,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd90,&local_268);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd90);
      testing::Message::~Message(&local_268);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
    uVar6 = (ulong)gmmParams._40_8_ >> ((char)(uint)OffsetInfo.StdLayout.TileDepthPitch - 1U & 0x3f)
    ;
    uVar4 = TileSize[(ulong)ResourceInfo._4_4_ - 2];
    uVar8 = (ulong)gmmParams._40_8_ >> ((char)(uint)OffsetInfo.StdLayout.TileDepthPitch - 1U & 0x3f)
    ;
    uVar1 = TileSize[(ulong)ResourceInfo._4_4_ - 2];
    uVar2 = TileSize[(ulong)ResourceInfo._4_4_ - 2];
    uVar5 = CTestResource::GetBppValue((CTestResource *)this,(TEST_BPP)ResourceInfo);
    OffsetInfo.StdLayout.TileDepthPitch._4_4_ =
         OffsetInfo.StdLayout.TileDepthPitch._4_4_ +
         (((int)uVar6 + (uVar4 - 1)) - ((int)uVar8 + (uVar1 - 1) & uVar2 - 1)) * uVar5;
    OffsetInfo_1.StdLayout.TileDepthPitch._4_4_ = 0;
    for (; (uint)OffsetInfo.StdLayout.TileDepthPitch <= gmmParams.BaseHeight;
        OffsetInfo.StdLayout.TileDepthPitch._0_4_ = (uint)OffsetInfo.StdLayout.TileDepthPitch + 1) {
      OffsetInfo_1.StdLayout.Offset = 0;
      OffsetInfo_1.StdLayout.TileRowPitch = 0;
      OffsetInfo_1.Render.XOffset = 0;
      OffsetInfo_1.Render.YOffset = 0;
      OffsetInfo_1.Render.ZOffset = 0;
      OffsetInfo_1.Render._20_4_ = 0;
      OffsetInfo_1.Lock.Pitch = 0;
      OffsetInfo_1.Lock.field_2 =
           (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      OffsetInfo_1.Render.field_0.Offset64 = 0;
      OffsetInfo_1.Frame = GMM_DISPLAY_BASE;
      OffsetInfo_1._28_4_ = 0;
      OffsetInfo_1.Lock.field_0.Offset64 = 0;
      OffsetInfo_1.MipLevel = 0;
      OffsetInfo_1.Slice = 0;
      OffsetInfo_1.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo_1.Plane = GMM_NO_PLANE;
      gtest_ar_5.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      OffsetInfo_1.ArrayIndex = 0;
      OffsetInfo_1._0_4_ = (uint)OffsetInfo.StdLayout.TileDepthPitch;
      (**(code **)(*(long *)_MipTailStart + 0x68))(_MipTailStart,&gtest_ar_5.message_);
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_2e8,"StartOfMip","OffsetInfo.Render.Offset64",
                 (uint *)((long)&OffsetInfo.StdLayout.TileDepthPitch + 4),
                 (unsigned_long *)&OffsetInfo_1.Lock.Pitch);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
      if (!bVar3) {
        testing::Message::Message(&local_2f0);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x1a9,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_2f0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
        testing::Message::~Message(&local_2f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_308,"MipTailOffsets[slot]","OffsetInfo.Render.XOffset",
                 MipTailOffsets + (long)OffsetInfo_1.StdLayout.TileDepthPitch._4_4_ + -2,
                 (uint *)&OffsetInfo_1.Render);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
      if (!bVar3) {
        testing::Message::Message(&local_310);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x1aa,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_310);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
        testing::Message::~Message(&local_310);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
      local_32c = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_328,"0",(int *)"OffsetInfo.Render.YOffset",&local_32c,
                 (type *)((long)&OffsetInfo_1.Render.field_0 + 4));
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
      if (!bVar3) {
        testing::Message::Message(&local_338);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x1ab,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_338);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
        testing::Message::~Message(&local_338);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
      local_354 = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_350,"0",(int *)"OffsetInfo.Render.ZOffset",&local_354,
                 &OffsetInfo_1.Render.XOffset);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
      if (!bVar3) {
        testing::Message::Message(&local_360);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
        testing::internal::AssertHelper::AssertHelper
                  (&local_368,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x1ac,pcVar7);
        testing::internal::AssertHelper::operator=(&local_368,&local_360);
        testing::internal::AssertHelper::~AssertHelper(&local_368);
        testing::Message::~Message(&local_360);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
      OffsetInfo_1.StdLayout.TileDepthPitch._4_4_ = OffsetInfo_1.StdLayout.TileDepthPitch._4_4_ + 1;
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,_MipTailStart);
    ResourceInfo._4_4_ = ResourceInfo._4_4_ + TEST_BPP_16;
  } while( true );
}

Assistant:

TEST_F(CTestGen9Resource, Test1DTileYsResourceMips)
{
    const uint32_t TileSize[TEST_BPP_MAX] = {65536, 32768, 16384, 8192, 4096};
    const uint32_t Mts[TEST_BPP_MAX]      = {32768, 16384, 8192, 4096, 2048};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_1D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledYs   = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.MaxLod               = 5;

    // Allocate all mips in 1 tile or multiple tiles, depending on the bpp
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 16 * 1024; // 16K is the max width you can specify
        gmmParams.BaseHeight  = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t MaxMip;
        uint32_t MipTailStart = gmmParams.MaxLod;
        for(MaxMip = 0; MaxMip <= gmmParams.MaxLod; MaxMip++)
        {
            if((gmmParams.BaseWidth64 >> MaxMip) <= Mts[i])
            {
                MipTailStart = MaxMip;
                break;
            }
        }

        uint32_t AlignedWidth = 0;
        for(int mip = 0; mip <= MaxMip; mip++)
        {
            // Since 1D doesn't have a height, mips are just based on width
            AlignedWidth += GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> mip, TileSize[i]);
            ;
        }

        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, TileSize[i]);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-arrayed

        // All mips should be right after one another linearly, until the miptail
        uint32_t StartOfMip = 0;
        int      mip;
        for(mip = 0; mip < MaxMip; mip++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.MipLevel            = mip;
            ResourceInfo->GetOffset(OffsetInfo);
            StartOfMip += (mip == 0 ? 0 : GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> (mip - 1), TileSize[i]) * GetBppValue(bpp));
            EXPECT_EQ(StartOfMip, OffsetInfo.Render.Offset64);
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);
            EXPECT_EQ(0, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        uint32_t MipTailOffsets[GMM_ULT_MAX_MIPMAP] = {32768, 16384, 8192, 4096, 2048, 1024, 768, 512, 448, 384, 320, 256, 192, 128, 64};
        // Check for offset inside miptails.
        EXPECT_EQ(MipTailStart, ResourceInfo->GetPackedMipTailStartLod());
        StartOfMip += GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> (mip - 1), TileSize[i]) * GetBppValue(bpp); // Start of MipTail
        for(int slot = 0; mip <= gmmParams.MaxLod; mip++, slot++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.MipLevel            = mip;
            ResourceInfo->GetOffset(OffsetInfo);
            EXPECT_EQ(StartOfMip, OffsetInfo.Render.Offset64);          // Start of Miptail
            EXPECT_EQ(MipTailOffsets[slot], OffsetInfo.Render.XOffset); // Offset within miptail
            EXPECT_EQ(0, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}